

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O3

xmlChar * xmlSchemaCollapseString(xmlChar *value)

{
  xmlChar *pxVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  if (value == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  lVar2 = 0;
  while ((uVar4 = (ulong)value[lVar2], uVar4 < 0x21 && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)))
  {
    lVar2 = lVar2 + 1;
  }
  pbVar11 = value + lVar2;
  lVar9 = 0;
  iVar5 = 0;
  pbVar10 = pbVar11;
  do {
    uVar8 = (uint)uVar4;
    if (uVar8 < 0x20) {
      if (uVar8 - 9 < 2) break;
      if (uVar8 == 0) goto LAB_001ad680;
      if (uVar8 == 0xd) break;
LAB_001ad61b:
      uVar4 = (ulong)pbVar10[1];
    }
    else {
      if (uVar8 != 0x20) goto LAB_001ad61b;
      uVar4 = (ulong)pbVar10[1];
      if ((uVar4 < 0x21) && ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0)) break;
    }
    pbVar10 = pbVar10 + 1;
    iVar5 = iVar5 + 1;
    lVar9 = lVar9 + 0x100000000;
  } while( true );
  if (iVar5 == 0) {
LAB_001ad680:
    pbVar6 = pbVar10 + -1;
    pbVar7 = pbVar10;
    if (pbVar11 < pbVar6) {
      do {
        if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
        pbVar6 = pbVar6 + -1;
      } while (pbVar11 < pbVar6);
      pbVar7 = pbVar6 + 1;
    }
    if ((lVar2 != 0) || (pbVar10 != pbVar7)) {
      pxVar1 = xmlStrndup(pbVar11,((int)pbVar7 - (int)value) - (int)lVar2);
      return pxVar1;
    }
  }
  else {
    pxVar1 = xmlStrdup(pbVar11);
    if (pxVar1 != (xmlChar *)0x0) {
      pbVar10 = pxVar1 + (lVar9 >> 0x20);
      pbVar11 = pbVar10;
      while( true ) {
        bVar3 = *pbVar11;
        uVar4 = (ulong)bVar3;
        if (0x20 < uVar4) break;
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 == 0) {
            *pbVar10 = 0;
            return pxVar1;
          }
          break;
        }
        do {
          pbVar11 = pbVar11 + 1;
          uVar4 = (ulong)*pbVar11;
          if (0x20 < uVar4) goto LAB_001ad66d;
        } while ((0x100002600U >> (uVar4 & 0x3f) & 1) != 0);
        if (uVar4 != 0) {
LAB_001ad66d:
          bVar3 = 0x20;
LAB_001ad679:
          *pbVar10 = bVar3;
          pbVar10 = pbVar10 + 1;
        }
      }
      pbVar11 = pbVar11 + 1;
      goto LAB_001ad679;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSchemaCollapseString(const xmlChar *value) {
    const xmlChar *start = value, *end, *f;
    xmlChar *g;
    int col = 0;

    if (value == NULL) return(NULL);
    while ((*start != 0) && (IS_BLANK_CH(*start))) start++;
    end = start;
    while (*end != 0) {
	if ((*end == ' ') && (IS_BLANK_CH(end[1]))) {
	    col = end - start;
	    break;
	} else if ((*end == 0xa) || (*end == 0x9) || (*end == 0xd)) {
	    col = end - start;
	    break;
	}
	end++;
    }
    if (col == 0) {
	f = end;
	end--;
	while ((end > start) && (IS_BLANK_CH(*end))) end--;
	end++;
	if ((start == value) && (f == end)) return(NULL);
	return(xmlStrndup(start, end - start));
    }
    start = xmlStrdup(start);
    if (start == NULL) return(NULL);
    g = (xmlChar *) (start + col);
    end = g;
    while (*end != 0) {
	if (IS_BLANK_CH(*end)) {
	    end++;
	    while (IS_BLANK_CH(*end)) end++;
	    if (*end != 0)
		*g++ = ' ';
	} else
	    *g++ = *end++;
    }
    *g = 0;
    return((xmlChar *) start);
}